

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfCloseOutputFile(ImfOutputFile *out)

{
  if (out != (ImfOutputFile *)0x0) {
    (**(code **)(*(long *)out + 8))();
  }
  return 1;
}

Assistant:

int
ImfCloseOutputFile (ImfOutputFile* out)
{
    try
    {
        delete outfile (out);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}